

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2EndDocument(void *ctx)

{
  xmlDocPtr doc;
  long lVar1;
  uint uVar2;
  xmlChar *pxVar3;
  
  if (ctx != (void *)0x0) {
    if ((((*(int *)((long)ctx + 0x9c) != 0) && (*(int *)((long)ctx + 0x18) != 0)) &&
        (doc = *(xmlDocPtr *)((long)ctx + 0x10), doc != (xmlDocPtr)0x0)) &&
       (doc->intSubset != (_xmlDtd *)0x0)) {
      uVar2 = xmlValidateDocumentFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),doc);
      *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar2;
    }
    lVar1 = *(long *)((long)ctx + 0x10);
    if ((lVar1 != 0) && (*(long *)(lVar1 + 0x70) == 0)) {
      pxVar3 = xmlGetActualEncoding((xmlParserCtxtPtr)ctx);
      if (pxVar3 != (xmlChar *)0x0) {
        pxVar3 = xmlStrdup(pxVar3);
        *(xmlChar **)(lVar1 + 0x70) = pxVar3;
        if (pxVar3 == (xmlChar *)0x0) {
          xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2EndDocument(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlDocPtr doc;

    if (ctx == NULL) return;
#ifdef LIBXML_VALID_ENABLED
    if (ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
	ctxt->valid &= xmlValidateDocumentFinal(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    doc = ctxt->myDoc;
    if ((doc != NULL) && (doc->encoding == NULL)) {
        const xmlChar *encoding = xmlGetActualEncoding(ctxt);

        if (encoding != NULL) {
            doc->encoding = xmlStrdup(encoding);
            if (doc->encoding == NULL)
                xmlSAX2ErrMemory(ctxt);
        }
    }
}